

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.hpp
# Opt level: O0

void __thiscall options::options(options *this,uint argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  long lVar3;
  options *in_RDX;
  int in_ESI;
  undefined1 *in_RDI;
  char *in_stack_fffffffffffffef8;
  string *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  bool local_da;
  string local_b8 [32];
  string local_98 [37];
  byte local_73;
  byte local_72;
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [24];
  char *in_stack_ffffffffffffffe0;
  
  *in_RDI = 1;
  if (in_ESI == 2) {
    pcVar1 = *(char **)&in_RDX->Ly;
    std::allocator<char>::allocator();
    local_72 = 0;
    local_73 = 0;
    std::__cxx11::string::string(local_38,pcVar1,&local_39);
    bVar2 = std::operator==(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    local_da = true;
    if (!bVar2) {
      pcVar1 = *(char **)&in_RDX->Ly;
      std::allocator<char>::allocator();
      local_72 = 1;
      std::__cxx11::string::string(local_70,pcVar1,&local_71);
      local_73 = 1;
      local_da = std::operator==(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    }
    if ((local_73 & 1) != 0) {
      std::__cxx11::string::~string(local_70);
    }
    if ((local_72 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
    }
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    if (local_da == false) {
      lVar3 = atol(*(char **)&in_RDX->Ly);
      *(int *)(in_RDI + 8) = (int)lVar3;
      *(int *)(in_RDI + 4) = (int)lVar3;
    }
    else {
      psVar4 = local_98;
      help_abi_cxx11_(in_RDX,in_stack_ffffffffffffffe0);
      std::operator<<((ostream *)&std::cerr,psVar4);
      std::__cxx11::string::~string(local_98);
    }
  }
  else if (in_ESI == 3) {
    lVar3 = atol(*(char **)&in_RDX->Ly);
    *(int *)(in_RDI + 4) = (int)lVar3;
    lVar3 = atol(*(char **)&in_RDX[1].Lx);
    *(int *)(in_RDI + 8) = (int)lVar3;
  }
  else {
    psVar4 = local_b8;
    help_abi_cxx11_(in_RDX,in_stack_ffffffffffffffe0);
    std::operator<<((ostream *)&std::cerr,psVar4);
    std::__cxx11::string::~string(local_b8);
  }
  return;
}

Assistant:

options(unsigned argc, char *argv[]) : valid(true) {
    switch (argc) {
    case 2:
      if (std::string(argv[1]) == "-h" || std::string(argv[1]) == "--help")
        std::cerr << help(argv[0]);
      else
        Lx = Ly = std::atol(argv[1]);
      return;
    case 3:
      Lx = std::atol(argv[1]);
      Ly = std::atol(argv[2]);
      return;
    default:
      std::cerr << help(argv[0]);
      return;
    }
  }